

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O0

byte * COSE_Encrypt_GetContent(HCOSE_ENCRYPT h,size_t *pcbContent,cose_errback *perror)

{
  _Bool _Var1;
  COSE_Encrypt *cose;
  cose_errback *perror_local;
  size_t *pcbContent_local;
  HCOSE_ENCRYPT h_local;
  
  _Var1 = IsValidEncryptHandle(h);
  if ((_Var1) && (pcbContent != (size_t *)0x0)) {
    *pcbContent = *(size_t *)(h + 0x60);
    h_local = *(HCOSE_ENCRYPT *)(h + 0x58);
  }
  else {
    if (perror != (cose_errback *)0x0) {
      perror->err = COSE_ERR_INVALID_PARAMETER;
    }
    h_local = (HCOSE_ENCRYPT)0x0;
  }
  return (byte *)h_local;
}

Assistant:

const byte * COSE_Encrypt_GetContent(HCOSE_ENCRYPT h, size_t * pcbContent, cose_errback * perror)
{
    COSE_Encrypt * cose = (COSE_Encrypt *) h;
    if (!IsValidEncryptHandle(h) || (pcbContent == NULL)) {
        if (perror != NULL) perror->err = COSE_ERR_INVALID_PARAMETER;
        return false;
    }

    *pcbContent = cose->cbContent;
    return cose->pbContent;
}